

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O0

PList * p_list_remove(PList *list,pconstpointer data)

{
  PList *local_38;
  PList *head;
  PList *prev;
  PList *cur;
  pconstpointer data_local;
  PList *list_local;
  
  if (list == (PList *)0x0) {
    list_local = (PList *)0x0;
  }
  else {
    head = (PList *)0x0;
    for (prev = list; local_38 = list, prev != (PList *)0x0; prev = prev->next) {
      if (prev->data == data) {
        if (head == (PList *)0x0) {
          local_38 = prev->next;
        }
        else {
          head->next = prev->next;
        }
        p_free(prev);
        break;
      }
      head = prev;
    }
    list_local = local_38;
  }
  return list_local;
}

Assistant:

P_LIB_API PList *
p_list_remove (PList		*list,
	       pconstpointer	data)
{
	PList *cur;
	PList *prev;
	PList *head;

	if (P_UNLIKELY (list == NULL))
		return NULL;

	for (head = list, prev = NULL, cur = list; cur != NULL;  prev = cur, cur = cur->next) {
		if (cur->data == data) {
			if (prev == NULL)
				head = cur->next;
			else
				prev->next = cur->next;

			p_free (cur);

			break;
		}
	}

	return head;
}